

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzidentifyrefpattern.cpp
# Opt level: O3

TPZAutoPointer<TPZRefPattern> __thiscall
TPZIdentifyRefPattern::GetUniform(TPZIdentifyRefPattern *this,TPZGeoEl *gel)

{
  uint uVar1;
  TPZRefPattern *this_00;
  pointer pcVar2;
  long *plVar3;
  long *in_RDX;
  string fullfilename;
  string local_40;
  
  uVar1 = (**(code **)(*in_RDX + 0xb8))();
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,*(long *)gel,
             (long)(gel->fMesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fVec.fExtAlloc +
             *(long *)gel + -0x60);
  std::__cxx11::string::append((char *)&local_40);
  if (uVar1 < 8) {
    std::__cxx11::string::append((char *)&local_40);
    std::__cxx11::string::append((char *)&local_40);
    this_00 = (TPZRefPattern *)operator_new(0x360);
    TPZRefPattern::TPZRefPattern(this_00,&local_40);
    pcVar2 = (pointer)operator_new(0x10);
    pcVar2[8] = '\0';
    pcVar2[9] = '\0';
    pcVar2[10] = '\0';
    pcVar2[0xb] = '\0';
    *(TPZRefPattern **)pcVar2 = this_00;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZIdentifyRefPattern::GetUniform ERROR unknown eltype : ",
               0x39);
    plVar3 = (long *)std::ostream::operator<<(&std::cerr,uVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    pcVar2 = (pointer)operator_new(0x10);
    pcVar2[8] = '\0';
    pcVar2[9] = '\0';
    pcVar2[10] = '\0';
    pcVar2[0xb] = '\0';
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
  }
  LOCK();
  pcVar2[8] = '\x01';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  UNLOCK();
  (this->fPath)._M_dataplus._M_p = pcVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return (TPZAutoPointer<TPZRefPattern>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZRefPattern> TPZIdentifyRefPattern::GetUniform(TPZGeoEl * gel){
	MElementType eltype = gel->Type();
	string fullfilename = fPath;
	fullfilename += "/";
	switch (eltype) {
		case (EPoint) : {
			fullfilename += "Point_";
			break;
		}
		case (EOned) : {
			fullfilename += "Linear_";
			break;
		}
		case (ETriangle) : {
			fullfilename += "Triang_";
			break;
		}
		case (EQuadrilateral) : {
			fullfilename += "Quad_";
			break;
		}
		case (ETetraedro) : {
			fullfilename += "Tetra_";
			break;
		}
		case (EPiramide)  : {
			fullfilename += "Piram_";
			break;
		}
		case (EPrisma) : {
			fullfilename += "Prism_";
			break;
		}
		case (ECube) : {
			fullfilename += "Hexa_";
			break;
		}
		default:{
			PZError << "TPZIdentifyRefPattern::GetUniform ERROR unknown eltype : " << eltype << endl;
			return (0);
		}
	}
	fullfilename += "Unif.rpt";
	TPZRefPattern *rp = new TPZRefPattern(fullfilename);
	return rp;
}